

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void libyuv::YPixel(uint8_t y,uint8_t *b,uint8_t *g,uint8_t *r,YuvConstants *yuvconstants)

{
  int iVar1;
  uint8_t uVar2;
  int iVar3;
  undefined7 in_register_00000039;
  
  iVar3 = (int)(((uint)((int)yuvconstants->kYToRgb[0] * (int)CONCAT71(in_register_00000039,y) *
                       0x101) >> 0x10) + (int)yuvconstants->kYBiasToRgb[0]) >> 6;
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  uVar2 = (uint8_t)iVar1;
  if (0xfe < iVar1) {
    uVar2 = 0xff;
  }
  *b = uVar2;
  *g = uVar2;
  *r = uVar2;
  return;
}

Assistant:

static __inline void YPixel(uint8_t y,
                            uint8_t* b,
                            uint8_t* g,
                            uint8_t* r,
                            const struct YuvConstants* yuvconstants) {
#if defined(__aarch64__) || defined(__arm__)
  int ygb = yuvconstants->kUVBiasBGR[3];
  int yg = yuvconstants->kYToRgb[1];
#else
  int ygb = yuvconstants->kYBiasToRgb[0];
  int yg = yuvconstants->kYToRgb[0];
#endif
  uint32_t y1 = (uint32_t)(y * 0x0101 * yg) >> 16;
  *b = Clamp(((int32_t)(y1) + ygb) >> 6);
  *g = Clamp(((int32_t)(y1) + ygb) >> 6);
  *r = Clamp(((int32_t)(y1) + ygb) >> 6);
}